

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O1

error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span> *
__thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::get_span_impl(error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
                *__return_storage_ptr__,
               buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
               *this,descriptor<pstore::details::posix_descriptor_traits> *io,byte_span *sp)

{
  maybe<unsigned_char,_void> *this_00;
  value_type vVar1;
  descriptor<pstore::details::posix_descriptor_traits> *pdVar2;
  anon_struct_8_0_00000001_for___align aVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  bool bVar5;
  bool bVar6;
  uchar *puVar7;
  tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
  *ptVar8;
  anon_struct_8_0_00000001_for___align *paVar9;
  error_code *peVar10;
  span<unsigned_char,__1L> *span;
  long __n2;
  extent_type<_1L> n;
  error_code eVar11;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<std::uint8_t>::iterator>
  x;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_e8;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
  *local_d8;
  byte_span *local_d0;
  span<unsigned_char,__1L> *local_c8;
  anon_union_24_2_eb5a95ea_for_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_1
  local_c0;
  char local_a8;
  anon_union_24_2_eb5a95ea_for_error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_1
  local_a0;
  char local_88;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *local_80;
  pointer local_78;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_70;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_60;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  
  local_e8 = sp->storage_;
  local_d8 = __return_storage_ptr__;
  if (((this->push_).valid_ == true) && (0 < (sp->storage_).super_extent_type<_1L>.size_)) {
    this_00 = &this->push_;
    puVar7 = maybe<unsigned_char,_void>::operator->(this_00);
    if ((sp->storage_).super_extent_type<_1L>.size_ < 1) {
      assert_failed("idx >= 0 && idx < storage_.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                    ,0x18a);
    }
    *(sp->storage_).data_ = *puVar7;
    if (this_00->valid_ == true) {
      this_00->valid_ = false;
    }
    local_e8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::span<unsigned_char,_-1L>::subspan
                         ((span<unsigned_char,__1L> *)&local_e8,1,-1);
  }
  local_d0 = sp;
  if (local_e8.super_extent_type<_1L>.size_ != 0) {
    local_80 = &this->pos_;
    span = &this->span_;
    local_c8 = span;
    do {
      if (this->is_eof_ != false) break;
      if (((this->pos_).span_ == (this->end_).span_) && ((this->pos_).index_ == (this->end_).index_)
         ) {
        (*this->refill_)((error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                          *)&local_c0,io,span);
        local_88 = '\x01';
        error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
        ::
        move_construct<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                  ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    *)&local_a0,
                   (error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                    *)&local_c0);
        if (local_a8 == '\0') {
          error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          value_storage_impl<pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    ((error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_c0);
        }
        else {
          error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          error_storage_impl<pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                    ((error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_c0);
        }
        if (local_88 == '\x01') {
          eVar11 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>
                   ::get_error((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                                *)&local_a0);
          local_d8->has_error_ = true;
          peVar10 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
                    ::
                    error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
                              (local_d8);
          peVar10->_M_value = eVar11._M_value;
          peVar10->_M_cat = eVar11._M_cat;
          if (local_88 != '\0') {
            error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
            ::
            error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                      ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                        *)&local_a0);
            return local_d8;
          }
          error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
          return local_d8;
        }
        ptVar8 = error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
                 ::
                 value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                           ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                             *)&local_a0);
        pdVar2 = (ptVar8->
                 super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>
                 ).
                 super__Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_false>
                 ._M_head_impl;
        if (pdVar2 != io) {
          pstore::details::descriptor<pstore::details::posix_descriptor_traits>::reset(io,-1);
          vVar1 = pdVar2->fd_;
          pdVar2->fd_ = -1;
          io->fd_ = vVar1;
        }
        paVar9 = (anon_struct_8_0_00000001_for___align *)
                 error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
                 ::
                 value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                           ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                             *)&local_a0);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                      &local_c0.error_storage_,span,0);
        aVar3 = *paVar9;
        aVar4 = paVar9[1];
        bVar5 = (anon_struct_8_0_00000001_for___align)local_c0._8_8_ == aVar4;
        bVar6 = local_c0.storage_.__align == aVar3;
        if (bVar5 && bVar6) {
          this->is_eof_ = true;
          aVar3 = (anon_struct_8_0_00000001_for___align)(local_d0->storage_).data_;
          pstore::gsl::details::extent_type<-1L>::extent_type
                    ((extent_type<_1L> *)&local_c0,(long)local_e8.data_ - (long)aVar3);
          local_d8->has_error_ = false;
          local_c0._8_8_ = aVar3;
          paVar9 = (anon_struct_8_0_00000001_for___align *)
                   error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
                   ::
                   value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                             (local_d8);
          *paVar9 = local_c0.storage_.__align;
          paVar9[1] = (anon_struct_8_0_00000001_for___align)local_c0._8_8_;
          paVar9[2] = (anon_struct_8_0_00000001_for___align)io;
        }
        else {
          (this->end_).span_ = (span<unsigned_char,__1L> *)aVar3;
          (this->end_).index_ = (ptrdiff_t)aVar4;
          pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
          span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                        &local_c0.error_storage_,span,0);
          (this->pos_).span_ = (span<unsigned_char,__1L> *)local_c0.storage_._0_8_;
          (this->pos_).index_ = local_c0._8_8_;
        }
        if (local_88 == '\0') {
          error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>
                    ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
        }
        else {
          error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>
          ::
          error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>&,std::error_code>
                    ((error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>
                      *)&local_a0);
        }
        span = local_c8;
        if (bVar5 && bVar6) {
          return local_d8;
        }
      }
      check_invariants(this);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_50,(this->pos_).span_,(this->pos_).index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_60,(this->end_).span_,(this->end_).index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                    &local_a0.error_storage_,local_50.span_,local_50.index_);
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                    &local_c0.error_storage_,local_60.span_,local_60.index_);
      if (local_c0.storage_.__align != local_a0.storage_.__align) {
        assert_failed("span_ == rhs.span_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                      ,0xa2);
      }
      n.size_ = local_c0._8_8_ - local_a0._8_8_;
      if (local_e8.super_extent_type<_1L>.size_ < (long)(local_c0._8_8_ - local_a0._8_8_)) {
        n.size_ = local_e8.super_extent_type<_1L>.size_;
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_70,(this->pos_).span_,(this->pos_).index_);
      if (0 < n.size_) {
        local_78 = local_e8.data_;
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator(&local_40,local_70.span_,local_70.index_);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
        span_iterator((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                      &local_a0.error_storage_,local_40.span_,local_40.index_);
        pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+
                  ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                   &local_c0.error_storage_,(difference_type)&local_40);
        span = local_c8;
        std::
        copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,unsigned_char*>
                  ((span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                   &local_a0.error_storage_,
                   (span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> *)
                   &local_c0.error_storage_,local_78);
      }
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator+=
                (local_80,n.size_);
      local_e8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                 pstore::gsl::span<unsigned_char,_-1L>::subspan
                           ((span<unsigned_char,__1L> *)&local_e8,n.size_,-1);
    } while (local_e8.super_extent_type<_1L>.size_.size_ != 0);
  }
  aVar3 = (anon_struct_8_0_00000001_for___align)(local_d0->storage_).data_;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_a0,(long)local_e8.data_ - (long)aVar3);
  local_d8->has_error_ = false;
  local_a0._8_8_ = aVar3;
  paVar9 = (anon_struct_8_0_00000001_for___align *)
           error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
           ::
           value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
                     (local_d8);
  *paVar9 = local_a0.storage_.__align;
  paVar9[1] = (anon_struct_8_0_00000001_for___align)local_a0._8_8_;
  paVar9[2] = (anon_struct_8_0_00000001_for___align)io;
  return local_d8;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span_impl (IO io, byte_span const & sp)
            -> error_or_n<IO, byte_span> {

            auto available = sp;
            if (push_ && sp.size () > 0) {
                sp[0] = *push_;
                push_.reset ();
                available = available.subspan (1);
            }

            while (!available.empty () && !is_eof_) {
                if (pos_ == end_) {
                    // Refill the buffer.
                    error_or_n<IO, gsl::span<std::uint8_t>::iterator> x = refill_ (io, span_);
                    if (!x) {
                        return error_or_n<IO, byte_span>{x.get_error ()};
                    }
                    io = std::move (get<0> (x));
                    auto const & end = get<1> (x);
                    if (end == span_.begin ()) {
                        // that's the end of the source data.
                        is_eof_ = true;
                        return error_or_n<IO, byte_span>{
                            in_place, io, byte_span{sp.data (), available.data () - sp.data ()}};
                    }

                    end_ = end;
                    pos_ = span_.begin ();
                }

                // If we have bytes in the buffer, copy as many as we can.

                this->check_invariants ();
                auto const to_copy = std::min (std::distance (pos_, end_), available.size ());
                std::copy_n (pos_, to_copy, available.data ());
                pos_ += to_copy;
                available = available.subspan (to_copy);
            }
            return error_or_n<IO, byte_span>{in_place, io,
                                             byte_span{sp.data (), available.data () - sp.data ()}};
        }